

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  cmListFileFunction *pcVar1;
  _Elt_pointer pvVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  cmListFileFunction *lff_00;
  string *name;
  bool bVar7;
  string oldDef;
  cmExecutionStatus local_6c;
  _Map_pointer local_68;
  char *local_60;
  _Elt_pointer local_58;
  char local_50;
  undefined7 uStack_4f;
  string *local_40;
  string *local_38;
  
  iVar4 = std::__cxx11::string::compare((char *)lff);
  if (iVar4 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)lff);
    if (iVar4 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffff98,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        bVar7 = local_68 != (_Map_pointer)0x0;
        if (!bVar7) {
          return bVar7;
        }
        local_60 = &stack0xffffffffffffffb0;
        local_58 = (_Elt_pointer)0x0;
        local_50 = '\0';
        pcVar5 = cmMakefile::GetDefinition
                           (mf,(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        if (pcVar5 != (char *)0x0) {
          pcVar5 = cmMakefile::GetDefinition
                             (mf,(this->Args).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          pvVar2 = local_58;
          strlen(pcVar5);
          std::__cxx11::string::_M_replace
                    ((ulong)&stack0xffffffffffffffa0,0,(char *)pvVar2,(ulong)pcVar5);
        }
        name = (this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        local_40 = (this->Args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        psVar6 = name + 1;
        if (psVar6 != local_40) {
          do {
            local_38 = psVar6;
            cmMakefile::AddDefinition
                      (mf,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(psVar6->_M_dataplus)._M_p);
            pcVar1 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (lff_00 = (this->Functions).
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start; lff_00 != pcVar1;
                lff_00 = lff_00 + 1) {
              local_6c.ReturnInvoked = false;
              local_6c.BreakInvoked = false;
              local_6c.ContinueInvoked = false;
              local_6c.NestedError = false;
              cmMakefile::ExecuteCommand(mf,lff_00,&local_6c);
              if (local_6c.ReturnInvoked == true) {
                inStatus->ReturnInvoked = true;
LAB_00263b26:
                cmMakefile::AddDefinition
                          (mf,(this->Args).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,local_60);
                goto LAB_00263b37;
              }
              if (local_6c.BreakInvoked != false) goto LAB_00263b26;
              if (local_6c.ContinueInvoked != false) break;
              if ((cmSystemTools::s_FatalErrorOccured != false) ||
                 (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) goto LAB_00263b37;
            }
            psVar6 = local_38 + 1;
          } while (psVar6 != local_40);
          name = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        }
        cmMakefile::AddDefinition(mf,name,local_60);
LAB_00263b37:
        if (local_60 != &stack0xffffffffffffffb0) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
        if (local_68 == (_Map_pointer)0x0) {
          return bVar7;
        }
        (*(code *)(*local_68)[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)();
        return bVar7;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (lff.Name.Lower == "foreach") {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (lff.Name.Lower == "endforeach") {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }

      for (std::string const& arg : cmMakeRange(this->Args).advance(1)) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], arg.c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (cmListFileFunction const& func : this->Functions) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}